

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

void __thiscall
embree::MetallicPaintMaterial::MetallicPaintMaterial
          (MetallicPaintMaterial *this,Vec3fa *shadeColor,Vec3fa *glitterColor,float glitterSpread,
          float eta)

{
  undefined8 uVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  SceneGraph::Node::Node((Node *)this,&local_48);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_001da410;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_001dab30;
  (this->base).type = 5;
  uVar1 = *(undefined8 *)((long)&shadeColor->field_0 + 8);
  *(undefined8 *)&(this->shadeColor).field_0 = *(undefined8 *)&shadeColor->field_0;
  *(undefined8 *)((long)&(this->shadeColor).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&glitterColor->field_0 + 8);
  *(undefined8 *)&(this->glitterColor).field_0 = *(undefined8 *)&glitterColor->field_0;
  *(undefined8 *)((long)&(this->glitterColor).field_0 + 8) = uVar1;
  this->glitterSpread = glitterSpread;
  this->eta = eta;
  return;
}

Assistant:

MetallicPaintMaterial (const Vec3fa& shadeColor, const Vec3fa& glitterColor, float glitterSpread, float eta)
      : base(MATERIAL_METALLIC_PAINT), shadeColor(shadeColor), glitterColor(glitterColor), glitterSpread(glitterSpread), eta(eta) {}